

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mgm.c
# Opt level: O0

int test_block(EVP_CIPHER *ciph,char *name,uchar *nonce,size_t nlen,uchar *aad,size_t alen,
              uchar *ptext,size_t plen,uchar *exp_ctext,uchar *exp_tag,uchar *key,int small)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  size_t sVar4;
  int iVar5;
  uchar *puVar6;
  long lVar7;
  uchar *puVar8;
  char *pcVar9;
  size_t __n;
  uchar auStack_a0 [22];
  bool local_8a;
  bool local_89;
  uchar *local_88;
  uchar *p_1;
  uchar *p;
  uint local_70;
  int i;
  int test;
  int rv;
  int ret;
  int tmplen;
  int outlen2;
  int outlen1;
  uchar *t;
  uchar *puStack_48;
  int tag_len;
  uchar *c;
  EVP_CIPHER_CTX *ctx;
  size_t alen_local;
  uchar *aad_local;
  size_t nlen_local;
  uchar *nonce_local;
  char *name_local;
  EVP_CIPHER *ciph_local;
  
  auStack_a0[0] = 0x8f;
  auStack_a0[1] = '\x14';
  auStack_a0[2] = '\x10';
  auStack_a0[3] = '\0';
  auStack_a0[4] = '\0';
  auStack_a0[5] = '\0';
  auStack_a0[6] = '\0';
  auStack_a0[7] = '\0';
  ctx = (EVP_CIPHER_CTX *)alen;
  alen_local = (size_t)aad;
  aad_local = (uchar *)nlen;
  nlen_local = (size_t)nonce;
  nonce_local = (uchar *)name;
  name_local = (char *)ciph;
  c = (uchar *)EVP_CIPHER_CTX_new();
  lVar2 = 8 - (plen + 0xf & 0xfffffffffffffff0);
  puStack_48 = auStack_a0 + lVar2;
  t._4_4_ = (int)aad_local;
  lVar1 = -((long)(int)aad_local + 0xfU & 0xfffffffffffffff0);
  puVar6 = puStack_48 + lVar1;
  test = 0;
  _outlen2 = puVar6;
  if ((EVP_CIPHER_CTX *)c == (EVP_CIPHER_CTX *)0x0) {
    puVar6[-8] = 0xf3;
    puVar6[-7] = '\x14';
    puVar6[-6] = '\x10';
    puVar6[-5] = '\0';
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    OPENSSL_die("assertion failed: ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_mgm.c"
                ,0xa3);
  }
  puVar3 = nonce_local;
  pcVar9 = "big chunks";
  if (small != 0) {
    pcVar9 = "small chunks";
  }
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\x1d\x15\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  printf("Encryption test %s [%s]: ",puVar3,pcVar9);
  puVar3 = c;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"&\x15\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_reset(puVar3);
  pcVar9 = name_local;
  puVar3 = c;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,">\x15\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_EncryptInit_ex((EVP_CIPHER_CTX *)puVar3,(EVP_CIPHER *)pcVar9,(ENGINE *)0x0,(uchar *)0x0,
                     (uchar *)0x0);
  puVar3 = c;
  iVar5 = (int)aad_local;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"V\x15\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)puVar3,9,iVar5,(void *)0x0);
  sVar4 = nlen_local;
  puVar3 = c;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"n\x15\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_EncryptInit_ex((EVP_CIPHER_CTX *)puVar3,(EVP_CIPHER *)0x0,(ENGINE *)0x0,key,(uchar *)sVar4);
  puVar3 = puStack_48;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"}\x15\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  memset(puVar3,0,plen);
  sVar4 = alen_local;
  puVar3 = c;
  if (small == 0) {
    iVar5 = (int)ctx;
    puVar6[-8] = 0x9f;
    puVar6[-7] = '\x15';
    puVar6[-6] = '\x10';
    puVar6[-5] = '\0';
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    EVP_EncryptUpdate((EVP_CIPHER_CTX *)puVar3,(uchar *)0x0,&tmplen,(uchar *)sVar4,iVar5);
    puVar8 = c;
    puVar3 = puStack_48;
    puVar6[-8] = 0xbb;
    puVar6[-7] = '\x15';
    puVar6[-6] = '\x10';
    puVar6[-5] = '\0';
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    EVP_EncryptUpdate((EVP_CIPHER_CTX *)puVar8,puVar3,&ret,ptext,(int)plen);
  }
  else {
    ret = 0;
    tmplen = 0;
    for (p._4_4_ = 0; puVar3 = c, (EVP_CIPHER_CTX *)(long)p._4_4_ < ctx; p._4_4_ = p._4_4_ + 1) {
      puVar8 = (uchar *)(alen_local + (long)p._4_4_);
      builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\x01\x16\x10",4);
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      EVP_EncryptUpdate((EVP_CIPHER_CTX *)puVar3,(uchar *)0x0,&rv,puVar8,1);
      tmplen = rv + tmplen;
    }
    p_1 = puStack_48;
    for (p._4_4_ = 0; puVar8 = c, puVar3 = p_1, (ulong)(long)p._4_4_ < plen; p._4_4_ = p._4_4_ + 1)
    {
      lVar7 = (long)p._4_4_;
      builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"P\x16\x10",4);
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      EVP_EncryptUpdate((EVP_CIPHER_CTX *)puVar8,puVar3,&rv,ptext + lVar7,1);
      p_1 = p_1 + rv;
      ret = rv + ret;
    }
  }
  puVar8 = c;
  puVar3 = puStack_48;
  puVar6[-8] = 0x88;
  puVar6[-7] = '\x16';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)puVar8,puVar3,&rv);
  puVar8 = c;
  iVar5 = t._4_4_;
  puVar3 = _outlen2;
  puVar6[-8] = 0x9d;
  puVar6[-7] = '\x16';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)puVar8,0x10,iVar5,puVar3);
  puVar3 = c;
  puVar6[-8] = 0xa6;
  puVar6[-7] = '\x16';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_reset(puVar3);
  puVar3 = puStack_48;
  local_89 = true;
  if (((EVP_CIPHER_CTX *)(long)tmplen == ctx) && (local_89 = true, (long)ret == plen)) {
    puVar6[-8] = 0xdb;
    puVar6[-7] = '\x16';
    puVar6[-6] = '\x10';
    puVar6[-5] = '\0';
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    iVar5 = memcmp(puVar3,exp_ctext,plen);
    puVar3 = _outlen2;
    local_89 = true;
    if (iVar5 == 0) {
      __n = (size_t)t._4_4_;
      puVar6[-8] = 0xfb;
      puVar6[-7] = '\x16';
      puVar6[-6] = '\x10';
      puVar6[-5] = '\0';
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      iVar5 = memcmp(puVar3,exp_tag,__n);
      local_89 = iVar5 != 0;
    }
  }
  local_70 = (uint)local_89;
  if (local_89 == false) {
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"<\x17\x10",4);
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    printf("Test passed\n");
  }
  else {
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,",\x17\x10",4);
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    printf("Test FAILED\n");
  }
  puVar3 = nonce_local;
  test = local_70 | test;
  pcVar9 = "big chunks";
  if (small != 0) {
    pcVar9 = "small chunks";
  }
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"o\x17\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  printf("Decryption test %s [%s]: ",puVar3,pcVar9);
  puVar3 = c;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"x\x17\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_reset(puVar3);
  pcVar9 = name_local;
  puVar3 = c;
  puVar6[-8] = 0x90;
  puVar6[-7] = '\x17';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_DecryptInit_ex((EVP_CIPHER_CTX *)puVar3,(EVP_CIPHER *)pcVar9,(ENGINE *)0x0,(uchar *)0x0,
                     (uchar *)0x0);
  puVar3 = c;
  iVar5 = (int)aad_local;
  puVar6[-8] = 0xa8;
  puVar6[-7] = '\x17';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)puVar3,9,iVar5,(void *)0x0);
  sVar4 = nlen_local;
  puVar3 = c;
  puVar6[-8] = 0xc0;
  puVar6[-7] = '\x17';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_DecryptInit_ex((EVP_CIPHER_CTX *)puVar3,(EVP_CIPHER *)0x0,(ENGINE *)0x0,key,(uchar *)sVar4);
  puVar3 = puStack_48;
  puVar6[-8] = 0xcf;
  puVar6[-7] = '\x17';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  memset(puVar3,0,plen);
  sVar4 = alen_local;
  puVar3 = c;
  if (small == 0) {
    iVar5 = (int)ctx;
    puVar6[-8] = 0xf1;
    puVar6[-7] = '\x17';
    puVar6[-6] = '\x10';
    puVar6[-5] = '\0';
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    EVP_DecryptUpdate((EVP_CIPHER_CTX *)puVar3,(uchar *)0x0,&tmplen,(uchar *)sVar4,iVar5);
    puVar8 = c;
    puVar3 = puStack_48;
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\r\x18\x10",4);
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    EVP_DecryptUpdate((EVP_CIPHER_CTX *)puVar8,puVar3,&ret,exp_ctext,(int)plen);
  }
  else {
    ret = 0;
    tmplen = 0;
    for (p._4_4_ = 0; puVar3 = c, (EVP_CIPHER_CTX *)(long)p._4_4_ < ctx; p._4_4_ = p._4_4_ + 1) {
      puVar8 = (uchar *)(alen_local + (long)p._4_4_);
      builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"S\x18\x10",4);
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      EVP_DecryptUpdate((EVP_CIPHER_CTX *)puVar3,(uchar *)0x0,&rv,puVar8,1);
      tmplen = rv + tmplen;
    }
    local_88 = puStack_48;
    for (p._4_4_ = 0; puVar8 = c, puVar3 = local_88, (ulong)(long)p._4_4_ < plen;
        p._4_4_ = p._4_4_ + 1) {
      lVar7 = (long)p._4_4_;
      puVar6[-8] = 0xa2;
      puVar6[-7] = '\x18';
      puVar6[-6] = '\x10';
      puVar6[-5] = '\0';
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      EVP_DecryptUpdate((EVP_CIPHER_CTX *)puVar8,puVar3,&rv,exp_ctext + lVar7,1);
      local_88 = local_88 + rv;
      ret = rv + ret;
    }
  }
  puVar3 = c;
  iVar5 = t._4_4_;
  puVar6[-8] = 0xde;
  puVar6[-7] = '\x18';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)puVar3,0x11,iVar5,exp_tag);
  puVar8 = c;
  puVar3 = puStack_48;
  puVar6[-8] = 0xef;
  puVar6[-7] = '\x18';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  i = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)puVar8,puVar3,&rv);
  puVar3 = c;
  puVar6[-8] = 0xfb;
  puVar6[-7] = '\x18';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_reset(puVar3);
  puVar3 = c;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\x04\x19\x10",4);
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)puVar3);
  puVar3 = puStack_48;
  local_8a = true;
  if (((EVP_CIPHER_CTX *)(long)tmplen == ctx) && (local_8a = true, (long)ret == plen)) {
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"9\x19\x10",4);
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    iVar5 = memcmp(puVar3,ptext,plen);
    local_8a = true;
    if (iVar5 == 0) {
      local_8a = i != 1;
    }
  }
  local_70 = (uint)local_8a;
  if (local_8a == false) {
    puVar6[-8] = 0x8a;
    puVar6[-7] = '\x19';
    puVar6[-6] = '\x10';
    puVar6[-5] = '\0';
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    printf("Test passed\n");
  }
  else {
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"z\x19\x10",4);
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    printf("Test FAILED\n");
  }
  return local_70 | test;
}

Assistant:

static int test_block(const EVP_CIPHER *ciph, const char *name, const unsigned char *nonce, size_t nlen,
                      const unsigned char *aad, size_t alen, const unsigned char *ptext, size_t plen,
                      const unsigned char *exp_ctext, const unsigned char *exp_tag,
                      const unsigned char * key, int small)
{
    EVP_CIPHER_CTX *ctx = EVP_CIPHER_CTX_new();
    unsigned char *c = alloca(plen);
    int tag_len = nlen;
    unsigned char *t = alloca(tag_len);
    int outlen1, outlen2, tmplen;
    int ret = 0, rv, test, i;

    OPENSSL_assert(ctx);
    printf("Encryption test %s [%s]: ", name, small ? "small chunks" : "big chunks");

    // test encrypt
    EVP_CIPHER_CTX_init(ctx);
    EVP_EncryptInit_ex(ctx, ciph, NULL, NULL, NULL);                    // Set cipher type and mode
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_IVLEN, nlen, NULL);      // Set IV length
    EVP_EncryptInit_ex(ctx, NULL, NULL, key, nonce);                    // Initialise key and IV
    memset(c, 0, plen);
    if (!small) {
        // test big chunks
        EVP_EncryptUpdate(ctx, NULL, &outlen1, aad, alen);              // Zero or more calls to specify any AAD
        EVP_EncryptUpdate(ctx, c, &outlen2, ptext, plen);               // Encrypt plaintext
    } else {
        // test small chunks
        outlen1 = outlen2 = 0;
        unsigned char *p;
        for (i = 0; i < alen; i++) {
            EVP_EncryptUpdate(ctx, NULL, &tmplen, aad + i, 1);
            outlen1 += tmplen;
        }
        for (i = 0, p = c; i < plen; i++) {
            EVP_EncryptUpdate(ctx, p, &tmplen, ptext + i, 1);
            p += tmplen;
            outlen2 += tmplen;
        }
    }
    EVP_EncryptFinal_ex(ctx, c, &tmplen);
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_GET_TAG, tag_len, t);
    EVP_CIPHER_CTX_cleanup(ctx);

    TEST_ASSERT(outlen1 != alen || outlen2 != plen ||
                memcmp(c, exp_ctext, plen) ||
                memcmp(t, exp_tag, tag_len));
    ret |= test;


    // test decrtypt
    printf("Decryption test %s [%s]: ", name, small ? "small chunks" : "big chunks");
    EVP_CIPHER_CTX_init(ctx);
    EVP_DecryptInit_ex(ctx, ciph, NULL, NULL, NULL);
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_IVLEN, nlen, NULL);
    EVP_DecryptInit_ex(ctx, NULL, NULL, key, nonce);
    memset(c, 0, plen);
    if (!small) {
        // test big chunks
        EVP_DecryptUpdate(ctx, NULL, &outlen1, aad, alen);
        EVP_DecryptUpdate(ctx, c, &outlen2, exp_ctext, plen);
    } else {
        // test small chunks
        outlen1 = outlen2 = 0;
        unsigned char *p;
        for (i = 0; i < alen; i++) {
            EVP_DecryptUpdate(ctx, NULL, &tmplen, aad + i, 1);
            outlen1 += tmplen;
        }
        for (i = 0, p = c; i < plen; i++) {
            EVP_DecryptUpdate(ctx, p, &tmplen, exp_ctext + i, 1);
            p += tmplen;
            outlen2 += tmplen;
        }
    }
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_TAG, tag_len, (void *)exp_tag);
    rv = EVP_DecryptFinal_ex(ctx, c, &tmplen);
    EVP_CIPHER_CTX_cleanup(ctx);
    EVP_CIPHER_CTX_free(ctx);

    TEST_ASSERT(outlen1 != alen || outlen2 != plen ||
                memcmp(c, ptext, plen) || rv != 1);
    ret |= test;

    return ret;
}